

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

longdouble *
trng::math::detail::GammaPQ_asympt_R<long_double>
          (longdouble *__return_storage_ptr__,longdouble a,longdouble eta,longdouble eta_squard_half
          )

{
  long lVar1;
  longdouble *plVar2;
  long lVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  longdouble beta [31];
  undefined1 local_21c [12];
  long local_210;
  longdouble local_204;
  longdouble alStack_1f8 [29];
  unkbyte10 local_28;
  unkbyte10 local_18;
  
  local_18 = _DAT_002a9a10;
  local_28 = _DAT_002a9a20;
  lVar1 = 0x1e0;
  lVar3 = 0x1e;
  do {
    local_210 = lVar3;
    *(longdouble *)(local_21c + lVar1 + 4) =
         *(longdouble *)("N5Catch10BinaryExprIRKeS2_EE" + lVar1 + 0x1b) +
         ((longdouble)lVar3 * *(longdouble *)((long)alStack_1f8 + lVar1)) / a;
    lVar1 = lVar1 + -0x10;
    lVar3 = lVar3 + -1;
  } while (lVar1 != 0x10);
  lVar4 = (longdouble)1;
  lVar1 = 0;
  lVar5 = (longdouble)0;
  do {
    local_21c._0_10_ = *(longdouble *)((long)alStack_1f8 + lVar1) * lVar4 + lVar5;
    if (((longdouble)local_21c._0_10_ == lVar5) &&
       (!NAN((longdouble)local_21c._0_10_) && !NAN(lVar5))) break;
    lVar4 = lVar4 * eta;
    lVar1 = lVar1 + 0x10;
    lVar5 = (longdouble)local_21c._0_10_;
  } while (lVar1 != 0x1f0);
  local_21c._0_10_ = (longdouble)local_21c._0_10_ / ((longdouble)1 + alStack_1f8[1] / a);
  local_204 = a;
  expl();
  local_21c._0_10_ = (longdouble)local_21c._0_10_ * in_ST0;
  plVar2 = (longdouble *)sqrtl();
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T GammaPQ_asympt_R(T a, T eta, T eta_squard_half) {
        GammaPQ_asympt_coefficients<T> coeffs;
        constexpr std::size_t n{coeffs.max_index() - 1};
        T beta[n];
        beta[n - 1] = coeffs.get(n);
        beta[n - 2] = coeffs.get(n - 1);
        for (std::ptrdiff_t i{n - 3}; i >= 0; --i)
          beta[i] = beta[i + 2] * (i + 2) / a + coeffs.get(i + 1);
        T eta_to_the_i{1};
        T y{0};
        for (std::size_t i{0}; i < n; ++i) {
          const T y_old{y};
          y += beta[i] * eta_to_the_i;
          if (y == y_old)
            break;
          eta_to_the_i *= eta;
        }
        return y / (1 + beta[1] / a) * exp(-a * eta_squard_half) / sqrt(a) *
               constants<T>::one_over_sqrt_2pi;
      }